

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
wabt::FileStream::CreateStderr(void)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  __uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true> in_RDI;
  
  puVar2 = (undefined8 *)operator_new(0x38);
  uVar1 = _stderr;
  puVar2[1] = 0;
  *(undefined4 *)(puVar2 + 2) = 0;
  puVar2[3] = 0;
  *puVar2 = &PTR__FileStream_00248290;
  puVar2[4] = uVar1;
  puVar2[5] = 0;
  *(undefined1 *)(puVar2 + 6) = 0;
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
   super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl = puVar2;
  return (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
         (tuple<wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
         in_RDI.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t
         .super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<FileStream> FileStream::CreateStderr() {
  return std::unique_ptr<FileStream>(new FileStream(stderr));
}